

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::
     ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  BinaryAggregateHeap<int,_int,_duckdb::LessThan> *this;
  idx_t iVar1;
  ArenaAllocator *pAVar2;
  ulong uVar3;
  STORAGE_TYPE *__s;
  InvalidInputException *pIVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  TYPE val_val;
  TYPE arg_val;
  UnifiedVectorFormat n_format;
  UnifiedVectorFormat arg_format;
  UnifiedVectorFormat val_format;
  UnifiedVectorFormat state_format;
  int local_184;
  string local_180;
  ulong local_160;
  long local_158;
  long *local_150;
  long local_148;
  long local_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  long *local_108;
  long local_100;
  long local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_108);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_150);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)inputs,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)(inputs + 0x68),(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)(inputs + 0xd0),(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  if (count != 0) {
    local_158 = local_70;
    uVar5 = 0;
    local_160 = count;
    do {
      uVar7 = uVar5;
      if (*local_108 != 0) {
        uVar7 = (ulong)*(uint *)(*local_108 + uVar5 * 4);
      }
      uVar6 = uVar5;
      if (*local_c0 != 0) {
        uVar6 = (ulong)*(uint *)(*local_c0 + uVar5 * 4);
      }
      if (((local_f8 == 0) || ((*(ulong *)(local_f8 + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f) & 1) != 0)
          ) && ((local_b0 == 0 ||
                ((*(ulong *)(local_b0 + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0)))) {
        uVar3 = uVar5;
        if (*local_78 != 0) {
          uVar3 = (ulong)*(uint *)(*local_78 + uVar5 * 4);
        }
        this = *(BinaryAggregateHeap<int,_int,_duckdb::LessThan> **)(local_158 + uVar3 * 8);
        if ((char)this[1].capacity == '\0') {
          uVar3 = uVar5;
          if (*local_150 != 0) {
            uVar3 = (ulong)*(uint *)(*local_150 + uVar5 * 4);
          }
          if (local_140 != 0) {
            if ((*(ulong *)(local_140 + (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) == 0) {
              pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_180,
                         "Invalid input for arg_min/arg_max: n value cannot be NULL","");
              duckdb::InvalidInputException::InvalidInputException(pIVar4,(string *)&local_180);
              __cxa_throw(pIVar4,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error
                         );
            }
          }
          iVar1 = *(idx_t *)(local_148 + uVar3 * 8);
          if ((long)iVar1 < 1) {
            pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_180,"Invalid input for arg_min/arg_max: n value must be > 0"
                       ,"");
            duckdb::InvalidInputException::InvalidInputException(pIVar4,(string *)&local_180);
            __cxa_throw(pIVar4,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
          }
          if (999999 < (long)iVar1) {
            pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_180,
                       "Invalid input for arg_min/arg_max: n value must be < %d","");
            InvalidInputException::InvalidInputException<long>(pIVar4,&local_180,1000000);
            __cxa_throw(pIVar4,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
          }
          pAVar2 = aggr_input->allocator;
          this->capacity = iVar1;
          __s = (STORAGE_TYPE *)duckdb::ArenaAllocator::AllocateAligned((ulong)pAVar2);
          memset(__s,0,this->capacity << 3);
          this->heap = __s;
          this->size = 0;
          *(undefined1 *)&this[1].capacity = 1;
          count = local_160;
        }
        local_180._M_dataplus._M_p._0_4_ = *(undefined4 *)(local_100 + uVar7 * 4);
        local_184 = *(int *)(local_b8 + uVar6 * 4);
        BinaryAggregateHeap<int,_int,_duckdb::LessThan>::Insert
                  (this,aggr_input->allocator,(int *)&local_180,&local_184);
      }
      uVar5 = uVar5 + 1;
    } while (count != uVar5);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
  }
  if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
  }
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  return;
}

Assistant:

static void ArgMinMaxNUpdate(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count, Vector &state_vector,
                             idx_t count) {

	auto &val_vector = inputs[0];
	auto &arg_vector = inputs[1];
	auto &n_vector = inputs[2];

	UnifiedVectorFormat val_format;
	UnifiedVectorFormat arg_format;
	UnifiedVectorFormat n_format;
	UnifiedVectorFormat state_format;

	auto val_extra_state = STATE::VAL_TYPE::CreateExtraState(val_vector, count);
	auto arg_extra_state = STATE::ARG_TYPE::CreateExtraState(arg_vector, count);

	STATE::VAL_TYPE::PrepareData(val_vector, count, val_extra_state, val_format);
	STATE::ARG_TYPE::PrepareData(arg_vector, count, arg_extra_state, arg_format);

	n_vector.ToUnifiedFormat(count, n_format);
	state_vector.ToUnifiedFormat(count, state_format);

	auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);

	for (idx_t i = 0; i < count; i++) {
		const auto arg_idx = arg_format.sel->get_index(i);
		const auto val_idx = val_format.sel->get_index(i);
		if (!arg_format.validity.RowIsValid(arg_idx) || !val_format.validity.RowIsValid(val_idx)) {
			continue;
		}
		const auto state_idx = state_format.sel->get_index(i);
		auto &state = *states[state_idx];

		// Initialize the heap if necessary and add the input to the heap
		if (!state.is_initialized) {
			static constexpr int64_t MAX_N = 1000000;
			const auto nidx = n_format.sel->get_index(i);
			if (!n_format.validity.RowIsValid(nidx)) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value cannot be NULL");
			}
			const auto nval = UnifiedVectorFormat::GetData<int64_t>(n_format)[nidx];
			if (nval <= 0) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value must be > 0");
			}
			if (nval >= MAX_N) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value must be < %d", MAX_N);
			}
			state.Initialize(aggr_input.allocator, UnsafeNumericCast<idx_t>(nval));
		}

		// Now add the input to the heap
		auto arg_val = STATE::ARG_TYPE::Create(arg_format, arg_idx);
		auto val_val = STATE::VAL_TYPE::Create(val_format, val_idx);

		state.heap.Insert(aggr_input.allocator, arg_val, val_val);
	}
}